

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

void __thiscall
icu_63::NFSubstitution::NFSubstitution
          (NFSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,UnicodeString *description,
          UErrorCode *status)

{
  char16_t cVar1;
  char16_t cVar2;
  int iVar3;
  NFRuleSet *pNVar4;
  DecimalFormatSymbols *symbols;
  DecimalFormat *this_00;
  int iVar5;
  int iVar6;
  short sVar7;
  int32_t iVar8;
  size_t size;
  UnicodeString workingDescription;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__NFSubstitution_0039d1a0;
  this->pos = _pos;
  this->ruleSet = (NFRuleSet *)0x0;
  this->numberFormat = (DecimalFormat *)0x0;
  UnicodeString::UnicodeString(&workingDescription,description);
  sVar7 = (description->fUnion).fStackFields.fLengthAndFlags;
  iVar5 = (int)sVar7 >> 5;
  iVar6 = (description->fUnion).fFields.fLength;
  iVar3 = iVar5;
  if (sVar7 < 0) {
    iVar3 = iVar6;
  }
  if (iVar3 < 2) {
LAB_0024a836:
    if (sVar7 < 0) {
      iVar5 = iVar6;
    }
    if (iVar5 == 0) goto LAB_0024a849;
LAB_0024a840:
    *status = U_PARSE_ERROR;
  }
  else {
    cVar1 = UnicodeString::doCharAt(description,0);
    sVar7 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar7 < 0) {
      iVar8 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar7 >> 5;
    }
    cVar2 = UnicodeString::doCharAt(description,iVar8 + -1);
    sVar7 = (description->fUnion).fStackFields.fLengthAndFlags;
    iVar6 = (description->fUnion).fFields.fLength;
    iVar5 = (int)sVar7 >> 5;
    if (cVar1 != cVar2) goto LAB_0024a836;
    if (sVar7 < 0) {
      iVar5 = iVar6;
    }
    UnicodeString::remove(&workingDescription,(char *)(ulong)(iVar5 - 1));
    UnicodeString::remove(&workingDescription,(char *)0x0);
LAB_0024a849:
    if (-1 < workingDescription.fUnion.fStackFields.fLengthAndFlags) {
      workingDescription.fUnion.fFields.fLength =
           (int)workingDescription.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (workingDescription.fUnion.fFields.fLength == 0) {
      this->ruleSet = _ruleSet;
      goto LAB_0024a890;
    }
    cVar1 = UnicodeString::doCharAt(&workingDescription,0);
    if (cVar1 == L'%') {
      pNVar4 = RuleBasedNumberFormat::findRuleSet(_ruleSet->owner,&workingDescription,status);
      this->ruleSet = pNVar4;
      goto LAB_0024a890;
    }
    size = 0;
    cVar1 = UnicodeString::doCharAt(&workingDescription,0);
    if (cVar1 != L'#') {
      size = 0;
      cVar1 = UnicodeString::doCharAt(&workingDescription,0);
      if (cVar1 != L'0') {
        cVar1 = UnicodeString::doCharAt(&workingDescription,0);
        if (cVar1 == L'>') {
          this->ruleSet = _ruleSet;
          this->numberFormat = (DecimalFormat *)0x0;
          goto LAB_0024a890;
        }
        goto LAB_0024a840;
      }
    }
    symbols = RuleBasedNumberFormat::getDecimalFormatSymbols(_ruleSet->owner);
    if (symbols == (DecimalFormatSymbols *)0x0) {
      *status = U_MISSING_RESOURCE_ERROR;
    }
    else {
      this_00 = (DecimalFormat *)UMemory::operator_new((UMemory *)0x170,size);
      if (this_00 == (DecimalFormat *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        DecimalFormat::DecimalFormat(this_00,&workingDescription,symbols,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          this->numberFormat = this_00;
        }
        else {
          (*(this_00->super_NumberFormat).super_Format.super_UObject._vptr_UObject[1])(this_00);
        }
      }
    }
  }
LAB_0024a890:
  UnicodeString::~UnicodeString(&workingDescription);
  return;
}

Assistant:

NFSubstitution::NFSubstitution(int32_t _pos,
                               const NFRuleSet* _ruleSet,
                               const UnicodeString& description,
                               UErrorCode& status)
                               : pos(_pos), ruleSet(NULL), numberFormat(NULL)
{
    // the description should begin and end with the same character.
    // If it doesn't that's a syntax error.  Otherwise,
    // makeSubstitution() was the only thing that needed to know
    // about these characters, so strip them off
    UnicodeString workingDescription(description);
    if (description.length() >= 2
        && description.charAt(0) == description.charAt(description.length() - 1))
    {
        workingDescription.remove(description.length() - 1, 1);
        workingDescription.remove(0, 1);
    }
    else if (description.length() != 0) {
        // throw new IllegalArgumentException("Illegal substitution syntax");
        status = U_PARSE_ERROR;
        return;
    }

    if (workingDescription.length() == 0) {
        // if the description was just two paired token characters
        // (i.e., "<<" or ">>"), it uses the rule set it belongs to to
        // format its result
        this->ruleSet = _ruleSet;
    }
    else if (workingDescription.charAt(0) == gPercent) {
        // if the description contains a rule set name, that's the rule
        // set we use to format the result: get a reference to the
        // names rule set
        this->ruleSet = _ruleSet->getOwner()->findRuleSet(workingDescription, status);
    }
    else if (workingDescription.charAt(0) == gPound || workingDescription.charAt(0) ==gZero) {
        // if the description begins with 0 or #, treat it as a
        // DecimalFormat pattern, and initialize a DecimalFormat with
        // that pattern (then set it to use the DecimalFormatSymbols
        // belonging to our formatter)
        const DecimalFormatSymbols* sym = _ruleSet->getOwner()->getDecimalFormatSymbols();
        if (!sym) {
            status = U_MISSING_RESOURCE_ERROR;
            return;
        }
        DecimalFormat *tempNumberFormat = new DecimalFormat(workingDescription, *sym, status);
        /* test for NULL */
        if (!tempNumberFormat) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if (U_FAILURE(status)) {
            delete tempNumberFormat;
            return;
        }
        this->numberFormat = tempNumberFormat;
    }
    else if (workingDescription.charAt(0) == gGreaterThan) {
        // if the description is ">>>", this substitution bypasses the
        // usual rule-search process and always uses the rule that precedes
        // it in its own rule set's rule list (this is used for place-value
        // notations: formats where you want to see a particular part of
        // a number even when it's 0)

        // this causes problems when >>> is used in a frationalPartSubstitution
        // this->ruleSet = NULL;
        this->ruleSet = _ruleSet;
        this->numberFormat = NULL;
    }
    else {
        // and of the description is none of these things, it's a syntax error

        // throw new IllegalArgumentException("Illegal substitution syntax");
        status = U_PARSE_ERROR;
    }
}